

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Base.cpp
# Opt level: O1

void __thiscall adios2::format::BP4Base::BP4Base(BP4Base *this,Comm *comm)

{
  BPBase::BPBase((BPBase *)&this->field_0xa0,comm);
  this->_vptr_BP4Base = (_func_int **)&PTR__BP4Base_00884840;
  *(undefined ***)&this->field_0xa0 = &PTR__BP4Base_00884878;
  (this->m_MetadataIndexTable)._M_h._M_buckets = &(this->m_MetadataIndexTable)._M_h._M_single_bucket
  ;
  (this->m_MetadataIndexTable)._M_h._M_bucket_count = 1;
  (this->m_MetadataIndexTable)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_MetadataIndexTable)._M_h._M_element_count = 0;
  (this->m_MetadataIndexTable)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_MetadataIndexTable)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_MetadataIndexTable)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  BufferSTL::BufferSTL(&this->m_MetadataIndex);
  this->m_LastVarLengthPosInBuffer = 0;
  return;
}

Assistant:

BP4Base::BP4Base(helper::Comm const &comm) : BPBase(comm) {}